

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
cbtBvhTriangleMeshShape::setOptimizedBvh
          (cbtBvhTriangleMeshShape *this,cbtOptimizedBvh *bvh,cbtVector3 *scaling)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  cbtScalar cVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar6;
  cbtVector3 local_20;
  undefined1 auVar5 [56];
  
  auVar5 = in_ZMM0._8_56_;
  this->m_bvh = bvh;
  this->m_ownsBvh = false;
  iVar2 = (*(this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[7])();
  cVar6 = ::operator-((cbtVector3 *)CONCAT44(extraout_var,iVar2),scaling);
  auVar4._0_8_ = cVar6.m_floats._0_8_;
  auVar4._8_56_ = auVar5;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar6.m_floats._8_8_;
  local_20.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar4._0_16_,auVar1);
  cVar3 = cbtVector3::length2(&local_20);
  if (1.1920929e-07 < cVar3) {
    cbtTriangleMeshShape::setLocalScaling(&this->super_cbtTriangleMeshShape,scaling);
  }
  return;
}

Assistant:

void cbtBvhTriangleMeshShape::setOptimizedBvh(cbtOptimizedBvh* bvh, const cbtVector3& scaling)
{
	cbtAssert(!m_bvh);
	cbtAssert(!m_ownsBvh);

	m_bvh = bvh;
	m_ownsBvh = false;
	// update the scaling without rebuilding the bvh
	if ((getLocalScaling() - scaling).length2() > SIMD_EPSILON)
	{
		cbtTriangleMeshShape::setLocalScaling(scaling);
	}
}